

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::FboTestCase::checkSampleCount
          (FboTestCase *this,deUint32 sizedFormat,int numSamples)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  NotSupportedError *this_00;
  uint uVar4;
  vector<int,_std::allocator<int>_> supportedSampleCounts;
  int numSampleCounts;
  vector<int,_std::allocator<int>_> local_68;
  int local_44;
  string local_40;
  long lVar2;
  
  iVar1 = 4;
  if ((int)sizedFormat < 0x8814) {
    uVar4 = sizedFormat - 0x8229;
    if (uVar4 < 0x14) {
      if ((0xfff55U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_01504a57;
      if ((0xa0U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_01504a55;
    }
    if (((sizedFormat - 0x8051 < 9) && ((0x1e1U >> (sizedFormat - 0x8051 & 0x1f) & 1) != 0)) ||
       (sizedFormat - 0x81a5 < 2)) goto LAB_01504a57;
  }
  else if ((int)sizedFormat < 0x8d48) {
    if ((int)sizedFormat < 0x8c3a) {
      if (((0x881a < (int)sizedFormat) && (sizedFormat != 0x881b)) && (sizedFormat == 0x88f0))
      goto LAB_01504a57;
    }
    else if (((sizedFormat - 0x8cac < 2) || (sizedFormat == 0x8c3a)) || (sizedFormat == 0x8c43))
    goto LAB_01504a57;
  }
  else if ((((sizedFormat - 0x8d62 < 0x2d) &&
            ((0x104104104001U >> ((ulong)(sizedFormat - 0x8d62) & 0x3f) & 1) != 0)) ||
           (sizedFormat == 0x8d48)) || (sizedFormat == 0x906f)) goto LAB_01504a57;
LAB_01504a55:
  iVar1 = 0;
LAB_01504a57:
  if (iVar1 < numSamples) {
    local_44 = numSamples;
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar2 = CONCAT44(extraout_var,iVar1);
    local_40._M_dataplus._M_p = (pointer)((ulong)local_40._M_dataplus._M_p._4_4_ << 0x20);
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (**(code **)(lVar2 + 0x880))(0x8d41,sizedFormat,0x9380,1);
    if (0 < (long)(int)local_40._M_dataplus._M_p) {
      std::vector<int,_std::allocator<int>_>::resize(&local_68,(long)(int)local_40._M_dataplus._M_p)
      ;
      (**(code **)(lVar2 + 0x880))
                (0x8d41,sizedFormat,0x80a9,
                 (ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
    }
    err = (**(code **)(lVar2 + 0x800))();
    glu::checkError(err,"Failed to query sample counts for format",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboTestCase.cpp"
                    ,0x169);
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_44);
    if (_Var3._M_current ==
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Sample count not supported","");
      tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void FboTestCase::checkSampleCount (deUint32 sizedFormat, int numSamples)
{
	const int minSampleCount = getMinimumSampleCount(sizedFormat);

	if (numSamples > minSampleCount)
	{
		// Exceeds spec-mandated minimum - need to check.
		const std::vector<int> supportedSampleCounts = querySampleCounts(m_context.getRenderContext().getFunctions(), sizedFormat);

		if (std::find(supportedSampleCounts.begin(), supportedSampleCounts.end(), numSamples) == supportedSampleCounts.end())
			throw tcu::NotSupportedError("Sample count not supported");
	}
}